

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool cmsys::SystemTools::SetPermissions(char *file,mode_t mode,bool honor_umask)

{
  bool bVar1;
  size_t sVar2;
  string local_48;
  
  if (file == (char *)0x0) {
    bVar1 = false;
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    sVar2 = strlen(file);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,file,file + sVar2);
    bVar1 = SetPermissions(&local_48,mode,honor_umask);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

bool SystemTools::SetPermissions(const char* file,
                                 mode_t mode,
                                 bool honor_umask)
{
  if ( !file )
    {
    return false;
    }
  return SystemTools::SetPermissions(
    std::string(file), mode, honor_umask);
}